

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

void FastPForLib::Simple16<false>::unpack5_2_6_3(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0x17 & 0x1f;
  puVar1[1] = *puVar2 >> 0x12 & 0x1f;
  puVar1[2] = *puVar2 >> 0xc & 0x3f;
  puVar1[3] = *puVar2 >> 6 & 0x3f;
  puVar1[4] = *puVar2 & 0x3f;
  *in = puVar2 + 1;
  *out = puVar1 + 5;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack5_2_6_3(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 23) & 0x1f;
  pout[1] = (pin[0] >> 18) & 0x1f;

  pout[2] = (pin[0] >> 12) & 0x3f;
  pout[3] = (pin[0] >> 6) & 0x3f;
  pout[4] = pin[0] & 0x3f;

  *in = pin + 1;
  *out = pout + 5;
}